

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

int __thiscall
QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::clone
          (QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  QNetworkRequestFactoryPrivate *this_00;
  
  this_00 = (QNetworkRequestFactoryPrivate *)operator_new(0x88);
  Qt::totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*>::get(&this->d);
  QNetworkRequestFactoryPrivate::QNetworkRequestFactoryPrivate
            (this_00,(QNetworkRequestFactoryPrivate *)this);
  return (int)this_00;
}

Assistant:

Q_INLINE_TEMPLATE T *QExplicitlySharedDataPointer<T>::clone()
{
    return new T(*d.get());
}